

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O0

void __thiscall OpenMD::RestReader::readReferenceStructure(RestReader *this)

{
  bool bVar1;
  element_type *this_00;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *__x;
  undefined8 *in_RDI;
  Vector3d COM;
  RealType mTot;
  RealType mass;
  int count;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> ref;
  MolecularRestraint *mRest;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  shared_ptr<OpenMD::GenericData> data;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  Vector<double,_3U> *in_stack_fffffffffffffe38;
  StuntDouble *in_stack_fffffffffffffe40;
  Molecule *in_stack_fffffffffffffe48;
  Molecule *in_stack_fffffffffffffe50;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  errorStruct *in_stack_fffffffffffffe70;
  Vector<double,_3U> *in_stack_fffffffffffffe78;
  Restraint *in_stack_fffffffffffffe80;
  Molecule *this_01;
  RestReader *this_02;
  RestReader *in_stack_fffffffffffffef0;
  double local_f0;
  Vector<double,_3U> local_e8 [2];
  double local_b8;
  Molecule *local_b0;
  int local_a4;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_a0;
  Vector<double,_3U> *local_88;
  allocator<char> local_59;
  string local_58 [48];
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x384705)
  ;
  this_02 = (RestReader *)(in_RDI + 1);
  SimInfo::getNGlobalIntegrableObjects((SimInfo *)*in_RDI);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (size_type)in_stack_fffffffffffffe58);
  scanFile(in_stack_fffffffffffffef0);
  readSet(this_02);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  local_20 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (MoleculeIterator *)in_stack_fffffffffffffe58);
  while (local_20 != (Molecule *)0x0) {
    this_01 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (allocator<char> *)in_stack_fffffffffffffe70);
    Molecule::getPropertyByName(in_stack_fffffffffffffe48,(string *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe40,
                            in_stack_fffffffffffffe38);
    if (bVar1) {
      std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe58);
      bVar1 = std::operator!=((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)
                              in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      if (bVar1) {
        this_00 = std::
                  __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x38484b);
        __x = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
              SimpleTypeData<OpenMD::Restraint_*>::getData(this_00);
        in_stack_fffffffffffffe80 =
             (Restraint *)
             (__x->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
        if (in_stack_fffffffffffffe80 == (Restraint *)0x0) {
          in_stack_fffffffffffffe78 = (Vector<double,_3U> *)0x0;
        }
        else {
          in_stack_fffffffffffffe78 =
               (Vector<double,_3U> *)
               __dynamic_cast(in_stack_fffffffffffffe80,&Restraint::typeinfo,
                              &MolecularRestraint::typeinfo,0);
        }
        local_88 = in_stack_fffffffffffffe78;
        if (in_stack_fffffffffffffe78 == (Vector<double,_3U> *)0x0) {
          in_stack_fffffffffffffe70 = &painCave;
          snprintf(painCave.errMsg,2000,"Can not cast RestraintData to MolecularRestraint\n");
          in_stack_fffffffffffffe70->severity = 1;
          in_stack_fffffffffffffe70->isFatal = 1;
          simError();
        }
        else {
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     0x384968);
          local_a4 = 0;
          local_f0 = 0.0;
          Vector<double,_3U>::Vector(local_e8,&local_f0);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          local_b8 = 0.0;
          local_28 = Molecule::beginIntegrableObject
                               ((Molecule *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                (iterator *)in_stack_fffffffffffffe58);
          while (local_28 != (StuntDouble *)0x0) {
            in_stack_fffffffffffffe58 =
                 (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 1);
            in_stack_fffffffffffffe64 = StuntDouble::getGlobalIntegrableObjectIndex(local_28);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](in_stack_fffffffffffffe58,(long)in_stack_fffffffffffffe64);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe48 = (Molecule *)StuntDouble::getMass(local_28);
            in_stack_fffffffffffffe50 = in_stack_fffffffffffffe48;
            local_b0 = in_stack_fffffffffffffe48;
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&local_a0,(long)local_a4);
            OpenMD::operator*((double)in_stack_fffffffffffffe48,
                              (Vector<double,_3U> *)in_stack_fffffffffffffe40);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffe48,
                              (Vector<double,_3U> *)in_stack_fffffffffffffe40);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffe48,
                       (Vector<double,_3U> *)in_stack_fffffffffffffe40);
            local_b8 = local_b8 + (double)local_b0;
            local_a4 = local_a4 + 1;
            in_stack_fffffffffffffe40 =
                 Molecule::nextIntegrableObject
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (iterator *)in_stack_fffffffffffffe58);
            local_28 = in_stack_fffffffffffffe40;
          }
          Vector<double,_3U>::operator/=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffe40,
                     (double)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe38 = local_88;
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     this_01,__x);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffe40,
                     (Vector3<double> *)in_stack_fffffffffffffe38);
          MolecularRestraint::setReferenceStructure
                    ((MolecularRestraint *)this_01,__x,(Vector3d *)in_stack_fffffffffffffe80);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffffe50);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffffe50);
        }
      }
      std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_>::~shared_ptr
                ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)0x384c00);
    }
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x384c2b);
    local_20 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          (MoleculeIterator *)in_stack_fffffffffffffe58);
  }
  return;
}

Assistant:

void RestReader::readReferenceStructure() {
    // We need temporary storage to keep track of all StuntDouble positions
    // in case some of the restraints are molecular (i.e. if they use
    // multiple SD positions to determine restrained orientations or positions:

    all_pos_.clear();
    all_pos_.resize(info_->getNGlobalIntegrableObjects());

    // Restraint files are just standard dump files, but with the reference
    // structure stored in the first frame (frame 0).
    // RestReader overloads readSet and explicitly handles all of the
    // ObjectRestraints in that method:

    scanFile();

    readSet();

    // all ObjectRestraints have been handled, now we have to worry about
    // molecular restraints:

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    // no need to worry about parallel molecules, as molecules are not
    // split across processor boundaries.  Just loop over all molecules
    // we know about:

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      // is this molecule restrained?
      std::shared_ptr<GenericData> data = mol->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:

        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);

        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // pointer to a MolecularRestraint:

          MolecularRestraint* mRest =
              dynamic_cast<MolecularRestraint*>(restData->getData());

          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // now we need to pack the stunt doubles for the reference
            // structure:

            std::vector<Vector3d> ref;
            int count = 0;
            RealType mass, mTot;
            Vector3d COM(0.0);

            mTot = 0.0;
            // loop over the stunt doubles in this molecule in the order we
            // will be looping them in the restraint code:

            for (sd = mol->beginIntegrableObject(j); sd != NULL;
                 sd = mol->nextIntegrableObject(j)) {
              // push back the reference positions of the stunt
              // doubles from the *globally* sorted array of
              // positions:

              ref.push_back(all_pos_[sd->getGlobalIntegrableObjectIndex()]);
              mass  = sd->getMass();
              COM   = COM + mass * ref[count];
              mTot  = mTot + mass;
              count = count + 1;
            }
            COM /= mTot;
            mRest->setReferenceStructure(ref, COM);
          }
        }
      }
    }
  }